

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::cftleaf(int n,int isplt,double *a,int nw,double *w)

{
  double *pdVar1;
  double *pdVar2;
  double *a_00;
  long lVar3;
  double *w_00;
  
  lVar3 = (long)nw;
  w_00 = w + lVar3 + -8;
  if (n == 0x200) {
    pdVar1 = w + lVar3 + -0x40;
    cftmdl1(0x80,a,pdVar1);
    cftf161(a,w_00);
    pdVar2 = w + lVar3 + -0x20;
    cftf162(a + 0x20,pdVar2);
    cftf161(a + 0x40,w_00);
    cftf161(a + 0x60,w_00);
    cftmdl2(0x80,a + 0x80,w + lVar3 + -0x80);
    cftf161(a + 0x80,w_00);
    cftf162(a + 0xa0,pdVar2);
    cftf161(a + 0xc0,w_00);
    cftf162(a + 0xe0,pdVar2);
    cftmdl1(0x80,a + 0x100,pdVar1);
    cftf161(a + 0x100,w_00);
    cftf162(a + 0x120,pdVar2);
    cftf161(a + 0x140,w_00);
    cftf161(a + 0x160,w_00);
    a_00 = a + 0x180;
    if (isplt == 0) {
      cftmdl2(0x80,a_00,w + lVar3 + -0x80);
      cftf162(a + 0x1e0,pdVar2);
    }
    else {
      cftmdl1(0x80,a_00,pdVar1);
      cftf161(a + 0x1e0,w_00);
    }
    cftf161(a_00,w_00);
    cftf162(a + 0x1a0,pdVar2);
    cftf161(a + 0x1c0,w_00);
    return;
  }
  pdVar1 = w + lVar3 + -0x20;
  cftmdl1(0x40,a,pdVar1);
  cftf081(a,w_00);
  cftf082(a + 0x10,w_00);
  cftf081(a + 0x20,w_00);
  cftf081(a + 0x30,w_00);
  cftmdl2(0x40,a + 0x40,w + lVar3 + -0x40);
  cftf081(a + 0x40,w_00);
  cftf082(a + 0x50,w_00);
  cftf081(a + 0x60,w_00);
  cftf082(a + 0x70,w_00);
  cftmdl1(0x40,a + 0x80,pdVar1);
  cftf081(a + 0x80,w_00);
  cftf082(a + 0x90,w_00);
  cftf081(a + 0xa0,w_00);
  cftf081(a + 0xb0,w_00);
  pdVar2 = a + 0xc0;
  if (isplt == 0) {
    cftmdl2(0x40,pdVar2,w + lVar3 + -0x40);
    cftf082(a + 0xf0,w_00);
  }
  else {
    cftmdl1(0x40,pdVar2,pdVar1);
    cftf081(a + 0xf0,w_00);
  }
  cftf081(pdVar2,w_00);
  cftf082(a + 0xd0,w_00);
  cftf081(a + 0xe0,w_00);
  return;
}

Assistant:

void cftleaf(int n, int isplt, double *a, int nw, double *w) {
#if 0
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
  void cftf161(double *a, double *w);
  void cftf162(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf082(double *a, double *w);
#endif

  if (n == 512) {
    cftmdl1(128, a, &w[nw - 64]);
    cftf161(a, &w[nw - 8]);
    cftf162(&a[32], &w[nw - 32]);
    cftf161(&a[64], &w[nw - 8]);
    cftf161(&a[96], &w[nw - 8]);
    cftmdl2(128, &a[128], &w[nw - 128]);
    cftf161(&a[128], &w[nw - 8]);
    cftf162(&a[160], &w[nw - 32]);
    cftf161(&a[192], &w[nw - 8]);
    cftf162(&a[224], &w[nw - 32]);
    cftmdl1(128, &a[256], &w[nw - 64]);
    cftf161(&a[256], &w[nw - 8]);
    cftf162(&a[288], &w[nw - 32]);
    cftf161(&a[320], &w[nw - 8]);
    cftf161(&a[352], &w[nw - 8]);
    if (isplt != 0) {
      cftmdl1(128, &a[384], &w[nw - 64]);
      cftf161(&a[480], &w[nw - 8]);
    } else {
      cftmdl2(128, &a[384], &w[nw - 128]);
      cftf162(&a[480], &w[nw - 32]);
    }
    cftf161(&a[384], &w[nw - 8]);
    cftf162(&a[416], &w[nw - 32]);
    cftf161(&a[448], &w[nw - 8]);
  } else {
    cftmdl1(64, a, &w[nw - 32]);
    cftf081(a, &w[nw - 8]);
    cftf082(&a[16], &w[nw - 8]);
    cftf081(&a[32], &w[nw - 8]);
    cftf081(&a[48], &w[nw - 8]);
    cftmdl2(64, &a[64], &w[nw - 64]);
    cftf081(&a[64], &w[nw - 8]);
    cftf082(&a[80], &w[nw - 8]);
    cftf081(&a[96], &w[nw - 8]);
    cftf082(&a[112], &w[nw - 8]);
    cftmdl1(64, &a[128], &w[nw - 32]);
    cftf081(&a[128], &w[nw - 8]);
    cftf082(&a[144], &w[nw - 8]);
    cftf081(&a[160], &w[nw - 8]);
    cftf081(&a[176], &w[nw - 8]);
    if (isplt != 0) {
      cftmdl1(64, &a[192], &w[nw - 32]);
      cftf081(&a[240], &w[nw - 8]);
    } else {
      cftmdl2(64, &a[192], &w[nw - 64]);
      cftf082(&a[240], &w[nw - 8]);
    }
    cftf081(&a[192], &w[nw - 8]);
    cftf082(&a[208], &w[nw - 8]);
    cftf081(&a[224], &w[nw - 8]);
  }
}